

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* gmlc::utilities::
  generalized_section_splitting<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            (basic_string_view<char,_std::char_traits<char>_> *line,
            basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,
            basic_string_view<char,_std::char_traits<char>_> *sectionStartCharacters,
            CharMapper<unsigned_char> *sectionMatch,bool compress)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  size_type sVar1;
  size_t sVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  byte in_R9B;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_t endLoc;
  size_type start;
  size_type d1;
  size_type sectionLoc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *strVec;
  undefined7 in_stack_fffffffffffffe18;
  uchar in_stack_fffffffffffffe1f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe30;
  char in_stack_fffffffffffffe36;
  char in_stack_fffffffffffffe37;
  char *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffef8;
  undefined1 compress_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff08;
  ulong local_80;
  ulong local_58;
  ulong local_38;
  
  compress_00 = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  __str._M_str._0_6_ = in_stack_fffffffffffffe30;
  __str._M_len = (size_t)in_stack_fffffffffffffe28;
  __str._M_str._6_1_ = in_stack_fffffffffffffe36;
  __str._M_str._7_1_ = in_stack_fffffffffffffe37;
  local_38 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                       (in_stack_fffffffffffffe20,__str,
                        CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  if (local_38 == 0xffffffffffffffff) {
    generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,(bool)compress_00);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x785c44);
    __str_00._M_str._0_6_ = in_stack_fffffffffffffe30;
    __str_00._M_len = (size_t)in_stack_fffffffffffffe28;
    __str_00._M_str._6_1_ = in_stack_fffffffffffffe36;
    __str_00._M_str._7_1_ = in_stack_fffffffffffffe37;
    local_58 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         (in_stack_fffffffffffffe20,__str_00,
                          CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    bVar4._M_str = in_stack_fffffffffffffe38;
    bVar4._M_len = in_stack_fffffffffffffe40;
    bVar5._M_str = (char *)in_stack_fffffffffffffe20;
    bVar5._M_len = (size_t)in_stack_fffffffffffffe28;
    if (local_58 == 0xffffffffffffffff) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe37,
                             CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                 in_stack_fffffffffffffe28);
    }
    else {
      local_80 = 0;
      while( true ) {
        sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
        if (sVar1 <= local_80) break;
        if (local_58 < local_38) {
          if (local_80 == local_58) {
            if ((in_R9B & 1) == 0) {
              std::__cxx11::string::string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffe37,
                                  CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)));
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)bVar5._M_str,
                          (value_type *)
                          CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         bVar5._M_str);
            }
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)bVar4._M_len,
                       (size_type)bVar4._M_str,
                       CONCAT17(in_stack_fffffffffffffe37,
                                CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)));
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe37,
                                   CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                       (basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len);
          }
          local_80 = local_58 + 1;
          __str_01._M_str._0_6_ = in_stack_fffffffffffffe30;
          __str_01._M_len = bVar5._M_len;
          __str_01._M_str._6_1_ = in_stack_fffffffffffffe36;
          __str_01._M_str._7_1_ = in_stack_fffffffffffffe37;
          local_58 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                               ((basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_str,
                                __str_01,CONCAT17(in_stack_fffffffffffffe1f,
                                                  in_stack_fffffffffffffe18));
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::operator[](in_RSI,local_38);
          std::basic_string_view<char,_std::char_traits<char>_>::operator[](in_RSI,local_38);
          CharMapper<unsigned_char>::operator[]
                    ((CharMapper<unsigned_char> *)bVar5._M_str,in_stack_fffffffffffffe1f);
          sVar2 = getChunkEnd<std::basic_string_view<char,std::char_traits<char>>>
                            (bVar4._M_len,
                             (basic_string_view<char,_std::char_traits<char>_> *)bVar4._M_str,
                             in_stack_fffffffffffffe37,in_stack_fffffffffffffe36);
          if (sVar2 == 0xffffffffffffffff) {
            bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              ((basic_string_view<char,_std::char_traits<char>_> *)bVar4._M_len,
                               (size_type)bVar4._M_str,
                               CONCAT17(in_stack_fffffffffffffe37,
                                        CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30
                                                )));
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe37,
                                   CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                       (basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len);
            local_80 = std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
          }
          else {
            __str_02._M_str._0_6_ = in_stack_fffffffffffffe30;
            __str_02._M_len = bVar5._M_len;
            __str_02._M_str._6_1_ = in_stack_fffffffffffffe36;
            __str_02._M_str._7_1_ = in_stack_fffffffffffffe37;
            sVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                              ((basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_str,
                               __str_02,CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18
                                                ));
            if (sVar3 == 0xffffffffffffffff) {
              std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)bVar4._M_len,
                         (size_type)bVar4._M_str,
                         CONCAT17(in_stack_fffffffffffffe37,
                                  CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)));
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe37,
                                     CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                         (basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len);
              local_80 = 0xffffffffffffffff;
              local_38 = 0xffffffffffffffff;
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)bVar4._M_len,
                         (size_type)bVar4._M_str,
                         CONCAT17(in_stack_fffffffffffffe37,
                                  CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)));
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe37,
                                     CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                         (basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len);
              __str_03._M_str._0_6_ = in_stack_fffffffffffffe30;
              __str_03._M_len = bVar5._M_len;
              __str_03._M_str._6_1_ = in_stack_fffffffffffffe36;
              __str_03._M_str._7_1_ = in_stack_fffffffffffffe37;
              local_38 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                   ((basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_str
                                    ,__str_03,
                                    CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
              local_80 = sVar3 + 1;
            }
            __str_04._M_str._0_6_ = in_stack_fffffffffffffe30;
            __str_04._M_len = bVar5._M_len;
            __str_04._M_str._6_1_ = in_stack_fffffffffffffe36;
            __str_04._M_str._7_1_ = in_stack_fffffffffffffe37;
            local_58 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                 ((basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_str,
                                  __str_04,CONCAT17(in_stack_fffffffffffffe1f,
                                                    in_stack_fffffffffffffe18));
          }
        }
        if ((local_58 == 0xffffffffffffffff) && (local_80 != 0xffffffffffffffff)) {
          in_stack_fffffffffffffe30 = (undefined6)local_80;
          in_stack_fffffffffffffe36 = (char)(local_80 >> 0x30);
          in_stack_fffffffffffffe37 = (char)(local_80 >> 0x38);
          sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
          if ((CONCAT17(in_stack_fffffffffffffe37,
                        CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)) < sVar1) ||
             ((in_R9B & 1) == 0)) {
            bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              ((basic_string_view<char,_std::char_traits<char>_> *)bVar4._M_len,
                               (size_type)bVar4._M_str,
                               CONCAT17(in_stack_fffffffffffffe37,
                                        CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30
                                                )));
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe37,
                                   CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                       (basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len);
          }
          local_80 = local_58;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<XO> generalized_section_splitting(
    const X& line,
    const X& delimiterCharacters,
    const X& sectionStartCharacters,
    const utilities::CharMapper<unsigned char>& sectionMatch,
    bool compress)
{
    auto sectionLoc = line.find_first_of(sectionStartCharacters);

    if (sectionLoc == X::npos) {
        return generalized_string_split<X, XO>(
            line, delimiterCharacters, compress);
    }
    std::vector<XO> strVec;

    auto d1 = line.find_first_of(delimiterCharacters);
    if (d1 == X::npos)  // there are no delimiters
    {
        strVec.emplace_back(line);
        return strVec;
    }
    decltype(sectionLoc) start = 0;

    while (start < line.length()) {
        if (sectionLoc > d1) {
            if (start == d1) {
                if (!compress) {
                    strVec.push_back(XO{});
                }
            } else {
                strVec.emplace_back(line.substr(start, d1 - start));
            }
            start = d1 + 1;
            d1 = line.find_first_of(delimiterCharacters, start);
        } else {
            // now we are in a quote
            auto endLoc = getChunkEnd(
                sectionLoc + 1,
                line,
                line[sectionLoc],
                sectionMatch[line[sectionLoc]]);
            if (endLoc != X::npos) {
                d1 = line.find_first_of(delimiterCharacters, endLoc + 1);
                if (d1 == X::npos) {
                    strVec.emplace_back(line.substr(start));
                    sectionLoc = d1;
                    start = d1;
                } else {
                    strVec.emplace_back(line.substr(start, d1 - start));
                    sectionLoc =
                        line.find_first_of(sectionStartCharacters, d1 + 1);
                    start = d1 + 1;
                }
                d1 = line.find_first_of(delimiterCharacters, start);
            } else {
                strVec.emplace_back(line.substr(start));
                start = line.length();
            }
        }
        // get the last string
        if (d1 == X::npos) {
            if (start != X::npos) {
                if ((start < line.length()) || (!compress)) {
                    strVec.emplace_back(line.substr(start));
                }
                start = d1;
            }
        }
    }
    return strVec;
}